

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O2

Wlc_Ntk_t * Wlc_NtkDupDfsSimple(Wlc_Ntk_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Wlc_Ntk_t *pNew;
  Wlc_Obj_t *pWVar3;
  Wlc_Obj_t *pObj;
  Vec_Int_t *pVVar4;
  char *pcVar5;
  int iVar6;
  
  Wlc_NtkCleanCopy(p);
  p_00 = Vec_IntAlloc(100);
  pNew = Wlc_NtkAlloc(p->pName,p->nObjsAlloc);
  iVar6 = p->fAsyncRst;
  iVar2 = p->fMemPorts;
  iVar1 = p->fEasyFfs;
  pNew->fSmtLib = p->fSmtLib;
  pNew->fAsyncRst = iVar6;
  pNew->fMemPorts = iVar2;
  pNew->fEasyFfs = iVar1;
  for (iVar6 = 0; iVar6 < (p->vCis).nSize; iVar6 = iVar6 + 1) {
    pWVar3 = Wlc_NtkCi(p,iVar6);
    Wlc_ObjDup(pNew,p,(int)(((long)pWVar3 - (long)p->pObjs) / 0x18),p_00);
  }
  for (iVar6 = 0; iVar2 = (p->vCos).nSize, iVar6 < iVar2; iVar6 = iVar6 + 1) {
    pWVar3 = Wlc_NtkCo(p,iVar6);
    Wlc_NtkDupDfs_rec(pNew,p,(int)(((long)pWVar3 - (long)p->pObjs) / 0x18),p_00);
  }
  for (iVar6 = 0; iVar6 < iVar2; iVar6 = iVar6 + 1) {
    pWVar3 = Wlc_NtkCo(p,iVar6);
    pObj = Wlc_ObjCopyObj(pNew,p,pWVar3);
    Wlc_ObjSetCo(pNew,pObj,*(uint *)pWVar3 >> 10 & 1);
    iVar2 = (p->vCos).nSize;
  }
  if (p->vInits != (Vec_Int_t *)0x0) {
    pVVar4 = Vec_IntDup(p->vInits);
    pNew->vInits = pVVar4;
  }
  if (p->pInits != (char *)0x0) {
    pcVar5 = Abc_UtilStrsav(p->pInits);
    pNew->pInits = pcVar5;
  }
  Vec_IntFree(p_00);
  if (p->pSpec != (char *)0x0) {
    pcVar5 = Abc_UtilStrsav(p->pSpec);
    pNew->pSpec = pcVar5;
  }
  return pNew;
}

Assistant:

Wlc_Ntk_t * Wlc_NtkDupDfsSimple( Wlc_Ntk_t * p )
{
    Wlc_Ntk_t * pNew;
    Wlc_Obj_t * pObj;
    Vec_Int_t * vFanins;
    int i;
    Wlc_NtkCleanCopy( p );
    vFanins = Vec_IntAlloc( 100 );
    pNew = Wlc_NtkAlloc( p->pName, p->nObjsAlloc );
    pNew->fSmtLib = p->fSmtLib;
    pNew->fAsyncRst = p->fAsyncRst;
    pNew->fMemPorts = p->fMemPorts;
    pNew->fEasyFfs = p->fEasyFfs;
    Wlc_NtkForEachCi( p, pObj, i )
        Wlc_ObjDup( pNew, p, Wlc_ObjId(p, pObj), vFanins );
    Wlc_NtkForEachCo( p, pObj, i )
        Wlc_NtkDupDfs_rec( pNew, p, Wlc_ObjId(p, pObj), vFanins );
    Wlc_NtkForEachCo( p, pObj, i )
        Wlc_ObjSetCo( pNew, Wlc_ObjCopyObj(pNew, p, pObj), pObj->fIsFi );
    if ( p->vInits )
    pNew->vInits = Vec_IntDup( p->vInits );
    if ( p->pInits )
    pNew->pInits = Abc_UtilStrsav( p->pInits );
    Vec_IntFree( vFanins );
    if ( p->pSpec )
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    return pNew;
}